

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.h
# Opt level: O1

void vorbis_deinit(stb_vorbis *p)

{
  Residue *pRVar1;
  Codebook *pCVar2;
  long lVar3;
  void *__ptr;
  long lVar4;
  long lVar5;
  ulong uVar6;
  
  if ((p->alloc).alloc_buffer == (char *)0x0) {
    free(p->vendor);
  }
  if (0 < p->comment_list_length) {
    lVar5 = 0;
    do {
      if ((p->alloc).alloc_buffer == (char *)0x0) {
        free(p->comment_list[lVar5]);
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < p->comment_list_length);
  }
  if ((p->alloc).alloc_buffer == (char *)0x0) {
    free(p->comment_list);
  }
  if ((p->residue_config != (Residue *)0x0) && (0 < p->residue_count)) {
    lVar5 = 0;
    do {
      pRVar1 = p->residue_config;
      if (pRVar1[lVar5].classdata != (uint8 **)0x0) {
        if (0 < p->codebooks[pRVar1[lVar5].classbook].entries) {
          lVar4 = 0;
          do {
            if ((p->alloc).alloc_buffer == (char *)0x0) {
              free(pRVar1[lVar5].classdata[lVar4]);
            }
            lVar4 = lVar4 + 1;
          } while (lVar4 < p->codebooks[pRVar1[lVar5].classbook].entries);
        }
        if ((p->alloc).alloc_buffer == (char *)0x0) {
          free(pRVar1[lVar5].classdata);
        }
      }
      if ((p->alloc).alloc_buffer == (char *)0x0) {
        free(pRVar1[lVar5].residue_books);
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < p->residue_count);
  }
  if (p->codebooks != (Codebook *)0x0) {
    if (0 < p->codebook_count) {
      lVar5 = 8;
      lVar4 = 0;
      do {
        pCVar2 = p->codebooks;
        if ((p->alloc).alloc_buffer == (char *)0x0) {
          free(*(void **)((long)pCVar2->fast_huffman + lVar5 + -0x30));
        }
        if ((p->alloc).alloc_buffer == (char *)0x0) {
          free(*(void **)((long)pCVar2->fast_huffman + lVar5 + -0x18));
        }
        if ((p->alloc).alloc_buffer == (char *)0x0) {
          free(*(void **)((long)pCVar2->fast_huffman + lVar5 + -0x10));
        }
        if ((p->alloc).alloc_buffer == (char *)0x0) {
          free(*(void **)((long)pCVar2->fast_huffman + lVar5 + 0x7f8));
        }
        if ((p->alloc).alloc_buffer == (char *)0x0) {
          lVar3 = *(long *)((long)&pCVar2->sorted_codewords + lVar5);
          __ptr = (void *)(lVar3 + -4);
          if (lVar3 == 0) {
            __ptr = (void *)0x0;
          }
          free(__ptr);
        }
        lVar4 = lVar4 + 1;
        lVar5 = lVar5 + 0x848;
      } while (lVar4 < p->codebook_count);
    }
    if ((p->alloc).alloc_buffer == (char *)0x0) {
      free(p->codebooks);
    }
  }
  if ((p->alloc).alloc_buffer == (char *)0x0) {
    free(p->floor_config);
  }
  if ((p->alloc).alloc_buffer == (char *)0x0) {
    free(p->residue_config);
  }
  if (p->mapping != (Mapping *)0x0) {
    if (0 < p->mapping_count) {
      lVar5 = 8;
      lVar4 = 0;
      do {
        if ((p->alloc).alloc_buffer == (char *)0x0) {
          free(*(void **)(p->mapping->submap_floor + lVar5 + -0x11));
        }
        lVar4 = lVar4 + 1;
        lVar5 = lVar5 + 0x30;
      } while (lVar4 < p->mapping_count);
    }
    if ((p->alloc).alloc_buffer == (char *)0x0) {
      free(p->mapping);
    }
  }
  if (0 < p->channels) {
    uVar6 = 0;
    do {
      if ((p->alloc).alloc_buffer == (char *)0x0) {
        free(p->channel_buffers[uVar6]);
      }
      if ((p->alloc).alloc_buffer == (char *)0x0) {
        free(p->previous_window[uVar6]);
      }
      if ((p->alloc).alloc_buffer == (char *)0x0) {
        free(p->finalY[uVar6]);
      }
    } while ((uVar6 < 0xf) && (uVar6 = uVar6 + 1, (long)uVar6 < (long)p->channels));
  }
  lVar5 = 0;
  do {
    if ((p->alloc).alloc_buffer == (char *)0x0) {
      free(p->A[lVar5]);
    }
    if ((p->alloc).alloc_buffer == (char *)0x0) {
      free(p->B[lVar5]);
    }
    if ((p->alloc).alloc_buffer == (char *)0x0) {
      free(p->C[lVar5]);
    }
    if ((p->alloc).alloc_buffer == (char *)0x0) {
      free(p->window[lVar5]);
    }
    if ((p->alloc).alloc_buffer == (char *)0x0) {
      free(p->bit_reverse[lVar5]);
    }
    lVar5 = lVar5 + 1;
  } while (lVar5 == 1);
  if (p->close_on_free != 0) {
    fclose((FILE *)p->f);
    return;
  }
  return;
}

Assistant:

static void vorbis_deinit(stb_vorbis *p)
{
   int i,j;

   setup_free(p, p->vendor);
   for (i=0; i < p->comment_list_length; ++i) {
      setup_free(p, p->comment_list[i]);
   }
   setup_free(p, p->comment_list);

   if (p->residue_config) {
      for (i=0; i < p->residue_count; ++i) {
         Residue *r = p->residue_config+i;
         if (r->classdata) {
            for (j=0; j < p->codebooks[r->classbook].entries; ++j)
               setup_free(p, r->classdata[j]);
            setup_free(p, r->classdata);
         }
         setup_free(p, r->residue_books);
      }
   }

   if (p->codebooks) {
      CHECK(p);
      for (i=0; i < p->codebook_count; ++i) {
         Codebook *c = p->codebooks + i;
         setup_free(p, c->codeword_lengths);
         setup_free(p, c->multiplicands);
         setup_free(p, c->codewords);
         setup_free(p, c->sorted_codewords);
         // c->sorted_values[-1] is the first entry in the array
         setup_free(p, c->sorted_values ? c->sorted_values-1 : NULL);
      }
      setup_free(p, p->codebooks);
   }
   setup_free(p, p->floor_config);
   setup_free(p, p->residue_config);
   if (p->mapping) {
      for (i=0; i < p->mapping_count; ++i)
         setup_free(p, p->mapping[i].chan);
      setup_free(p, p->mapping);
   }
   CHECK(p);
   for (i=0; i < p->channels && i < STB_VORBIS_MAX_CHANNELS; ++i) {
      setup_free(p, p->channel_buffers[i]);
      setup_free(p, p->previous_window[i]);
      #ifdef STB_VORBIS_NO_DEFER_FLOOR
      setup_free(p, p->floor_buffers[i]);
      #endif
      setup_free(p, p->finalY[i]);
   }
   for (i=0; i < 2; ++i) {
      setup_free(p, p->A[i]);
      setup_free(p, p->B[i]);
      setup_free(p, p->C[i]);
      setup_free(p, p->window[i]);
      setup_free(p, p->bit_reverse[i]);
   }
   #ifndef STB_VORBIS_NO_STDIO
   if (p->close_on_free) fclose(p->f);
   #endif
}